

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void fulfill_or_reject_promise(JSContext *ctx,JSValue promise,JSValue value,BOOL is_reject)

{
  JSValue new_val;
  JSValue v;
  JSValue JVar1;
  JSValue JVar2;
  int *piVar3;
  JSValueUnion in_RCX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  int64_t in_R8;
  int in_R9D;
  JSValue JVar4;
  JSRuntime *rt;
  JSValue args [5];
  JSPromiseReactionData *rd;
  list_head *el1;
  list_head *el;
  JSPromiseData *s;
  JSPromiseReactionData *in_stack_fffffffffffffef8;
  JSContext *rt_00;
  JSValue *pval;
  JSContext *in_stack_ffffffffffffff10;
  JSValueUnion in_stack_ffffffffffffff18;
  JSRuntime *in_stack_ffffffffffffff20;
  list_head *local_68;
  list_head *local_60;
  
  JVar4.tag = in_RDX;
  JVar4.u.ptr = in_RSI.ptr;
  piVar3 = (int *)JS_GetOpaque(JVar4,0x2a);
  if ((piVar3 != (int *)0x0) && (*piVar3 == 0)) {
    pval = (JSValue *)(piVar3 + 0xc);
    v.tag = in_R8;
    v.u.ptr = in_RCX.ptr;
    rt_00 = in_RDI;
    JVar4 = JS_DupValue(in_RDI,v);
    new_val.tag = (int64_t)in_stack_ffffffffffffff20;
    new_val.u.float64 = in_stack_ffffffffffffff18.float64;
    set_value(in_stack_ffffffffffffff10,pval,new_val);
    *piVar3 = in_R9D + 1;
    if ((*piVar3 == 2) &&
       ((piVar3[10] == 0 &&
        (in_stack_ffffffffffffff20 = in_RDI->rt,
        in_stack_ffffffffffffff20->host_promise_rejection_tracker !=
        (JSHostPromiseRejectionTracker *)0x0)))) {
      in_stack_fffffffffffffef8 =
           (JSPromiseReactionData *)in_stack_ffffffffffffff20->host_promise_rejection_tracker_opaque
      ;
      JVar2.tag = in_RDX;
      JVar2.u.ptr = in_RSI.ptr;
      JVar1.tag = in_R8;
      JVar1.u.ptr = in_RCX.ptr;
      (*in_stack_ffffffffffffff20->host_promise_rejection_tracker)
                (in_RDI,JVar2,JVar1,0,in_stack_fffffffffffffef8);
    }
    local_60 = *(list_head **)(piVar3 + (long)in_R9D * 4 + 4);
    local_68 = local_60->next;
    while (local_60 != (list_head *)(piVar3 + (long)in_R9D * 4 + 2)) {
      JS_EnqueueJob((JSContext *)local_60[1].prev,(JSJobFunc *)JVar4.tag,JVar4.u._4_4_,
                    (JSValue *)in_stack_ffffffffffffff20);
      list_del(local_60);
      promise_reaction_data_free((JSRuntime *)rt_00,in_stack_fffffffffffffef8);
      local_60 = local_68;
      local_68 = local_68->next;
    }
    local_60 = *(list_head **)(piVar3 + (long)(1 - in_R9D) * 4 + 4);
    local_68 = local_60->next;
    while (local_60 != (list_head *)(piVar3 + (long)(1 - in_R9D) * 4 + 2)) {
      list_del(local_60);
      promise_reaction_data_free((JSRuntime *)rt_00,in_stack_fffffffffffffef8);
      local_60 = local_68;
      local_68 = local_68->next;
    }
  }
  return;
}

Assistant:

static void fulfill_or_reject_promise(JSContext *ctx, JSValueConst promise,
                                      JSValueConst value, BOOL is_reject)
{
    JSPromiseData *s = JS_GetOpaque(promise, JS_CLASS_PROMISE);
    struct list_head *el, *el1;
    JSPromiseReactionData *rd;
    JSValueConst args[5];

    if (!s || s->promise_state != JS_PROMISE_PENDING)
        return; /* should never happen */
    set_value(ctx, &s->promise_result, JS_DupValue(ctx, value));
    s->promise_state = JS_PROMISE_FULFILLED + is_reject;
#ifdef DUMP_PROMISE
    printf("fulfill_or_reject_promise: is_reject=%d\n", is_reject);
#endif
    if (s->promise_state == JS_PROMISE_REJECTED && !s->is_handled) {
        JSRuntime *rt = ctx->rt;
        if (rt->host_promise_rejection_tracker) {
            rt->host_promise_rejection_tracker(ctx, promise, value, FALSE,
                                               rt->host_promise_rejection_tracker_opaque);
        }
    }

    list_for_each_safe(el, el1, &s->promise_reactions[is_reject]) {
        rd = list_entry(el, JSPromiseReactionData, link);
        args[0] = rd->resolving_funcs[0];
        args[1] = rd->resolving_funcs[1];
        args[2] = rd->handler;
        args[3] = JS_NewBool(ctx, is_reject);
        args[4] = value;
        JS_EnqueueJob(ctx, promise_reaction_job, 5, args);
        list_del(&rd->link);
        promise_reaction_data_free(ctx->rt, rd);
    }

    list_for_each_safe(el, el1, &s->promise_reactions[1 - is_reject]) {
        rd = list_entry(el, JSPromiseReactionData, link);
        list_del(&rd->link);
        promise_reaction_data_free(ctx->rt, rd);
    }
}